

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O1

int trytop(rnndb *db,char *file,xmlNode *node)

{
  xmlChar *pxVar1;
  xmlAttr *attr;
  xmlNode *attr_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint64_t uVar7;
  rnnenum *prVar8;
  rnnenum **pprVar9;
  rnnvalue *prVar10;
  rnnvalue **pprVar11;
  char *pcVar12;
  rnnbitset *prVar13;
  rnnbitset **pprVar14;
  rnnbitfield *prVar15;
  rnnbitfield **pprVar16;
  rnnspectype *prVar17;
  rnnspectype **pprVar18;
  rnngroup *prVar19;
  rnngroup **pprVar20;
  rnndomain *prVar21;
  rnndomain **pprVar22;
  rnnauthor *prVar23;
  char *pcVar24;
  char **ppcVar25;
  rnnauthor **pprVar26;
  rnndelem *prVar27;
  rnndelem **pprVar28;
  ulong uVar29;
  xmlNode *node_00;
  xmlNode *node_01;
  xmlNode *node_02;
  xmlNode *node_03;
  xmlNode *node_04;
  _xmlNode *p_Var30;
  _xmlAttr *p_Var31;
  long lVar32;
  rnndb *prVar33;
  char *local_60;
  uint64_t local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  pxVar1 = node->name;
  iVar2 = strcmp((char *)pxVar1,"enum");
  if (iVar2 == 0) {
    p_Var31 = node->properties;
    if (p_Var31 == (_xmlAttr *)0x0) {
      pcVar24 = (char *)0x0;
      iVar4 = 0;
      iVar2 = 0;
      local_60 = (char *)0x0;
      local_48 = (char *)0x0;
      local_40 = (char *)0x0;
    }
    else {
      local_40 = (char *)0x0;
      local_48 = (char *)0x0;
      local_60 = (char *)0x0;
      iVar2 = 0;
      iVar4 = 0;
      pcVar24 = (char *)0x0;
      do {
        pxVar1 = p_Var31->name;
        iVar5 = strcmp((char *)pxVar1,"name");
        if (iVar5 == 0) {
          pcVar24 = getattrib(db,file,(uint)node->line,p_Var31);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"bare");
          if (iVar5 == 0) {
            iVar2 = getboolattrib(db,file,(uint)node->line,p_Var31);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"inline");
            if (iVar5 == 0) {
              iVar4 = getboolattrib(db,file,(uint)node->line,p_Var31);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"prefix");
              if (iVar5 == 0) {
                pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                local_60 = strdup(pcVar12);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"varset");
                if (iVar5 == 0) {
                  pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                  local_48 = strdup(pcVar12);
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"variants");
                  if (iVar5 == 0) {
                    pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                    local_40 = strdup(pcVar12);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for enum\n",file,
                            (ulong)node->line,pxVar1);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
        p_Var31 = p_Var31->next;
      } while (p_Var31 != (_xmlAttr *)0x0);
    }
    if (pcVar24 != (char *)0x0) {
      iVar5 = db->enumsnum;
      if (0 < (long)iVar5) {
        pprVar9 = db->enums;
        lVar32 = 0;
        do {
          prVar8 = pprVar9[lVar32];
          iVar3 = strcmp(prVar8->name,pcVar24);
          if (iVar3 == 0) goto LAB_00249433;
          lVar32 = lVar32 + 1;
        } while (iVar5 != lVar32);
      }
      prVar8 = (rnnenum *)0x0;
LAB_00249433:
      if (prVar8 == (rnnenum *)0x0) {
        prVar8 = (rnnenum *)calloc(0x78,1);
        pcVar24 = strdup(pcVar24);
        prVar8->name = pcVar24;
        prVar8->isinline = iVar4;
        prVar8->bare = iVar2;
        (prVar8->varinfo).prefixstr = local_60;
        (prVar8->varinfo).varsetstr = local_48;
        (prVar8->varinfo).variantsstr = local_40;
        prVar8->file = file;
        iVar2 = db->enumsmax;
        if (iVar2 <= iVar5) {
          iVar4 = 0x10;
          if (iVar2 != 0) {
            iVar4 = iVar2 * 2;
          }
          db->enumsmax = iVar4;
          pprVar9 = (rnnenum **)realloc(db->enums,(long)iVar4 << 3);
          db->enums = pprVar9;
        }
        iVar2 = db->enumsnum;
        db->enumsnum = iVar2 + 1;
        db->enums[iVar2] = prVar8;
      }
      else {
        pcVar24 = (prVar8->varinfo).prefixstr;
        if (((((local_60 != (char *)0x0 || pcVar24 != (char *)0x0) &&
              (((local_60 == (char *)0x0 || (pcVar24 == (char *)0x0)) ||
               (iVar5 = strcmp(pcVar24,local_60), iVar5 != 0)))) ||
             ((pcVar24 = (prVar8->varinfo).varsetstr,
              local_48 != (char *)0x0 || pcVar24 != (char *)0x0 &&
              (((local_48 == (char *)0x0 || (pcVar24 == (char *)0x0)) ||
               (iVar5 = strcmp(pcVar24,local_48), iVar5 != 0)))))) ||
            ((pcVar24 = (prVar8->varinfo).variantsstr,
             local_40 != (char *)0x0 || pcVar24 != (char *)0x0 &&
             (((local_40 == (char *)0x0 || (pcVar24 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar24,local_40), iVar5 != 0)))))) ||
           ((prVar8->isinline != iVar4 || (prVar8->bare != iVar2)))) {
          fprintf(_stderr,"%s:%d: merge fail for enum %s\n",file,(ulong)node->line,node->name);
          db->estatus = 1;
        }
        free(local_60);
        free(local_48);
        free(local_40);
      }
      for (prVar33 = (rnndb *)node->children; prVar33 != (rnndb *)0x0;
          prVar33 = (rnndb *)prVar33->bitsets) {
        if (*(int *)&(prVar33->copyright).license == 1) {
          iVar2 = strcmp((char *)(prVar33->copyright).authors,"value");
          if (iVar2 == 0) {
            prVar10 = parsevalue(db,file,(xmlNode *)prVar33);
            if (prVar10 != (rnnvalue *)0x0) {
              iVar2 = prVar8->valsmax;
              if (iVar2 <= prVar8->valsnum) {
                iVar4 = iVar2 * 2;
                if (iVar2 == 0) {
                  iVar4 = 0x10;
                }
                prVar8->valsmax = iVar4;
                pprVar11 = (rnnvalue **)realloc(prVar8->vals,(long)iVar4 << 3);
                prVar8->vals = pprVar11;
              }
              iVar2 = prVar8->valsnum;
              prVar8->valsnum = iVar2 + 1;
              prVar8->vals[iVar2] = prVar10;
            }
          }
          else {
            pcVar24 = file;
            iVar2 = trytop(db,file,(xmlNode *)prVar33);
            if ((iVar2 == 0) && (iVar2 = trydoc(prVar33,pcVar24,node_00), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in enum: <%s>\n",file,
                      (ulong)*(ushort *)&prVar33->files,(prVar33->copyright).authors);
              db->estatus = 1;
            }
          }
        }
      }
      return 1;
    }
    uVar29 = (ulong)node->line;
    pcVar24 = "%s:%d: nameless enum\n";
LAB_0024a73f:
    fprintf(_stderr,pcVar24,file,uVar29);
    db->estatus = 1;
    return 1;
  }
  iVar2 = strcmp((char *)pxVar1,"bitset");
  if (iVar2 == 0) {
    p_Var31 = node->properties;
    if (p_Var31 == (_xmlAttr *)0x0) {
      pcVar24 = (char *)0x0;
      iVar4 = 0;
      iVar2 = 0;
      local_60 = (char *)0x0;
      local_48 = (char *)0x0;
      local_40 = (char *)0x0;
    }
    else {
      local_40 = (char *)0x0;
      local_48 = (char *)0x0;
      local_60 = (char *)0x0;
      iVar2 = 0;
      iVar4 = 0;
      pcVar24 = (char *)0x0;
      do {
        pxVar1 = p_Var31->name;
        iVar5 = strcmp((char *)pxVar1,"name");
        if (iVar5 == 0) {
          pcVar24 = getattrib(db,file,(uint)node->line,p_Var31);
        }
        else {
          iVar5 = strcmp((char *)pxVar1,"bare");
          if (iVar5 == 0) {
            iVar2 = getboolattrib(db,file,(uint)node->line,p_Var31);
          }
          else {
            iVar5 = strcmp((char *)pxVar1,"inline");
            if (iVar5 == 0) {
              iVar4 = getboolattrib(db,file,(uint)node->line,p_Var31);
            }
            else {
              iVar5 = strcmp((char *)pxVar1,"prefix");
              if (iVar5 == 0) {
                pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                local_60 = strdup(pcVar12);
              }
              else {
                iVar5 = strcmp((char *)pxVar1,"varset");
                if (iVar5 == 0) {
                  pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                  local_48 = strdup(pcVar12);
                }
                else {
                  iVar5 = strcmp((char *)pxVar1,"variants");
                  if (iVar5 == 0) {
                    pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                    local_40 = strdup(pcVar12);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for bitset\n",file,
                            (ulong)node->line,pxVar1);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
        p_Var31 = p_Var31->next;
      } while (p_Var31 != (_xmlAttr *)0x0);
    }
    if (pcVar24 != (char *)0x0) {
      iVar5 = db->bitsetsnum;
      if (0 < (long)iVar5) {
        pprVar14 = db->bitsets;
        lVar32 = 0;
        do {
          prVar13 = pprVar14[lVar32];
          iVar3 = strcmp(prVar13->name,pcVar24);
          if (iVar3 == 0) goto LAB_0024994a;
          lVar32 = lVar32 + 1;
        } while (iVar5 != lVar32);
      }
      prVar13 = (rnnbitset *)0x0;
LAB_0024994a:
      if (prVar13 == (rnnbitset *)0x0) {
        prVar13 = (rnnbitset *)calloc(0x70,1);
        pcVar24 = strdup(pcVar24);
        prVar13->name = pcVar24;
        prVar13->isinline = iVar4;
        prVar13->bare = iVar2;
        (prVar13->varinfo).prefixstr = local_60;
        (prVar13->varinfo).varsetstr = local_48;
        (prVar13->varinfo).variantsstr = local_40;
        prVar13->file = file;
        iVar2 = db->bitsetsmax;
        if (iVar2 <= iVar5) {
          iVar4 = 0x10;
          if (iVar2 != 0) {
            iVar4 = iVar2 * 2;
          }
          db->bitsetsmax = iVar4;
          pprVar14 = (rnnbitset **)realloc(db->bitsets,(long)iVar4 << 3);
          db->bitsets = pprVar14;
        }
        iVar2 = db->bitsetsnum;
        db->bitsetsnum = iVar2 + 1;
        db->bitsets[iVar2] = prVar13;
      }
      else {
        pcVar24 = (prVar13->varinfo).prefixstr;
        if ((((local_60 != (char *)0x0 || pcVar24 != (char *)0x0) &&
             (((local_60 == (char *)0x0 || (pcVar24 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar24,local_60), iVar5 != 0)))) ||
            ((pcVar24 = (prVar13->varinfo).varsetstr,
             local_48 != (char *)0x0 || pcVar24 != (char *)0x0 &&
             (((local_48 == (char *)0x0 || (pcVar24 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar24,local_48), iVar5 != 0)))))) ||
           (((pcVar24 = (prVar13->varinfo).variantsstr,
             local_40 != (char *)0x0 || pcVar24 != (char *)0x0 &&
             (((local_40 == (char *)0x0 || (pcVar24 == (char *)0x0)) ||
              (iVar5 = strcmp(pcVar24,local_40), iVar5 != 0)))) ||
            ((prVar13->isinline != iVar4 || (prVar13->bare != iVar2)))))) {
          fprintf(_stderr,"%s:%d: merge fail for bitset %s\n",file,(ulong)node->line,node->name);
          db->estatus = 1;
        }
        free(local_60);
        free(local_48);
        free(local_40);
      }
      for (prVar33 = (rnndb *)node->children; prVar33 != (rnndb *)0x0;
          prVar33 = (rnndb *)prVar33->bitsets) {
        if (*(int *)&(prVar33->copyright).license == 1) {
          iVar2 = strcmp((char *)(prVar33->copyright).authors,"bitfield");
          if (iVar2 == 0) {
            prVar15 = parsebitfield(db,file,(xmlNode *)prVar33);
            if (prVar15 != (rnnbitfield *)0x0) {
              iVar2 = prVar13->bitfieldsmax;
              if (iVar2 <= prVar13->bitfieldsnum) {
                iVar4 = iVar2 * 2;
                if (iVar2 == 0) {
                  iVar4 = 0x10;
                }
                prVar13->bitfieldsmax = iVar4;
                pprVar16 = (rnnbitfield **)realloc(prVar13->bitfields,(long)iVar4 << 3);
                prVar13->bitfields = pprVar16;
              }
              iVar2 = prVar13->bitfieldsnum;
              prVar13->bitfieldsnum = iVar2 + 1;
              prVar13->bitfields[iVar2] = prVar15;
            }
          }
          else {
            pcVar24 = file;
            iVar2 = trytop(db,file,(xmlNode *)prVar33);
            if ((iVar2 == 0) && (iVar2 = trydoc(prVar33,pcVar24,node_01), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in bitset: <%s>\n",file,
                      (ulong)*(ushort *)&prVar33->files,(prVar33->copyright).authors);
              db->estatus = 1;
            }
          }
        }
      }
      return 1;
    }
    uVar29 = (ulong)node->line;
    pcVar24 = "%s:%d: nameless bitset\n";
    goto LAB_0024a73f;
  }
  iVar2 = strcmp((char *)pxVar1,"group");
  if (iVar2 == 0) {
    p_Var31 = node->properties;
    if (p_Var31 == (_xmlAttr *)0x0) {
      pcVar24 = (char *)0x0;
    }
    else {
      pcVar24 = (char *)0x0;
      do {
        pxVar1 = p_Var31->name;
        iVar2 = strcmp((char *)pxVar1,"name");
        if (iVar2 == 0) {
          pcVar24 = getattrib(db,file,(uint)node->line,p_Var31);
        }
        else {
          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for group\n",file,(ulong)node->line,pxVar1)
          ;
          db->estatus = 1;
        }
        p_Var31 = p_Var31->next;
      } while (p_Var31 != (_xmlAttr *)0x0);
    }
    if (pcVar24 != (char *)0x0) {
      iVar2 = db->groupsnum;
      if (0 < (long)iVar2) {
        pprVar20 = db->groups;
        lVar32 = 0;
        do {
          prVar19 = pprVar20[lVar32];
          iVar4 = strcmp(prVar19->name,pcVar24);
          if (iVar4 == 0) goto LAB_00249e0b;
          lVar32 = lVar32 + 1;
        } while (iVar2 != lVar32);
      }
      prVar19 = (rnngroup *)0x0;
LAB_00249e0b:
      if (prVar19 == (rnngroup *)0x0) {
        prVar19 = (rnngroup *)calloc(0x18,1);
        pcVar24 = strdup(pcVar24);
        prVar19->name = pcVar24;
        iVar4 = db->groupsmax;
        if (iVar4 <= iVar2) {
          iVar2 = 0x10;
          if (iVar4 != 0) {
            iVar2 = iVar4 * 2;
          }
          db->groupsmax = iVar2;
          pprVar20 = (rnngroup **)realloc(db->groups,(long)iVar2 << 3);
          db->groups = pprVar20;
        }
        iVar2 = db->groupsnum;
        db->groupsnum = iVar2 + 1;
        db->groups[iVar2] = prVar19;
      }
      for (prVar33 = (rnndb *)node->children; prVar33 != (rnndb *)0x0;
          prVar33 = (rnndb *)prVar33->bitsets) {
        if (*(int *)&(prVar33->copyright).license == 1) {
          prVar27 = trydelem(db,file,(xmlNode *)prVar33);
          if (prVar27 == (rnndelem *)0x0) {
            pcVar24 = file;
            iVar2 = trytop(db,file,(xmlNode *)prVar33);
            if ((iVar2 == 0) && (iVar2 = trydoc(prVar33,pcVar24,node_03), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in group: <%s>\n",file,
                      (ulong)*(ushort *)&prVar33->files,(prVar33->copyright).authors);
              db->estatus = 1;
            }
          }
          else {
            iVar2 = prVar19->subelemsmax;
            if (iVar2 <= prVar19->subelemsnum) {
              iVar4 = iVar2 * 2;
              if (iVar2 == 0) {
                iVar4 = 0x10;
              }
              prVar19->subelemsmax = iVar4;
              pprVar28 = (rnndelem **)realloc(prVar19->subelems,(long)iVar4 << 3);
              prVar19->subelems = pprVar28;
            }
            iVar2 = prVar19->subelemsnum;
            prVar19->subelemsnum = iVar2 + 1;
            prVar19->subelems[iVar2] = prVar27;
          }
        }
      }
      return 1;
    }
    uVar29 = (ulong)node->line;
    pcVar24 = "%s:%d: nameless group\n";
    goto LAB_0024a73f;
  }
  iVar2 = strcmp((char *)pxVar1,"domain");
  if (iVar2 != 0) {
    iVar2 = strcmp((char *)pxVar1,"spectype");
    if (iVar2 == 0) {
      prVar17 = (rnnspectype *)calloc(0x90,1);
      prVar17->file = file;
      p_Var31 = node->properties;
      if (p_Var31 != (_xmlAttr *)0x0) {
        do {
          iVar2 = strcmp((char *)p_Var31->name,"name");
          if (iVar2 == 0) {
            pcVar24 = getattrib(db,file,(uint)node->line,p_Var31);
            pcVar24 = strdup(pcVar24);
            prVar17->name = pcVar24;
          }
          else {
            iVar2 = trytypeattr(db,file,node,p_Var31,&prVar17->typeinfo);
            if (iVar2 == 0) {
              fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for spectype\n",file,(ulong)node->line,
                      p_Var31->name);
              db->estatus = 1;
            }
          }
          p_Var31 = p_Var31->next;
        } while (p_Var31 != (_xmlAttr *)0x0);
      }
      pcVar24 = prVar17->name;
      if (pcVar24 != (char *)0x0) {
        iVar2 = db->spectypesnum;
        if (0 < (long)iVar2) {
          pprVar18 = db->spectypes;
          lVar32 = 0;
          do {
            iVar4 = strcmp(pprVar18[lVar32]->name,pcVar24);
            if (iVar4 == 0) {
              fprintf(_stderr,"%s:%d: duplicated spectype name %s\n",file,(ulong)node->line,pcVar24)
              ;
              goto LAB_0024a797;
            }
            lVar32 = lVar32 + 1;
          } while (iVar2 != lVar32);
        }
        iVar4 = db->spectypesmax;
        if (iVar4 <= iVar2) {
          iVar2 = 0x10;
          if (iVar4 != 0) {
            iVar2 = iVar4 * 2;
          }
          db->spectypesmax = iVar2;
          pprVar18 = (rnnspectype **)realloc(db->spectypes,(long)iVar2 << 3);
          db->spectypes = pprVar18;
        }
        iVar2 = db->spectypesnum;
        db->spectypesnum = iVar2 + 1;
        db->spectypes[iVar2] = prVar17;
        prVar33 = (rnndb *)node->children;
        if (prVar33 != (rnndb *)0x0) {
          do {
            if ((((*(int *)&(prVar33->copyright).license == 1) &&
                 (iVar2 = trytypetag(db,file,(xmlNode *)prVar33,&prVar17->typeinfo), iVar2 == 0)) &&
                (pcVar24 = file, iVar2 = trytop(db,file,(xmlNode *)prVar33), iVar2 == 0)) &&
               (iVar2 = trydoc(prVar33,pcVar24,node_02), iVar2 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in spectype: <%s>\n",file,
                      (ulong)*(ushort *)&prVar33->files,(prVar33->copyright).authors);
              db->estatus = 1;
            }
            prVar33 = (rnndb *)prVar33->bitsets;
          } while (prVar33 != (rnndb *)0x0);
          return 1;
        }
        return 1;
      }
      uVar29 = (ulong)node->line;
      pcVar24 = "%s:%d: nameless spectype\n";
    }
    else {
      iVar2 = strcmp((char *)pxVar1,"import");
      if (iVar2 != 0) {
        iVar2 = strcmp((char *)pxVar1,"copyright");
        if (iVar2 != 0) {
          return 0;
        }
        for (attr = node->properties; attr != (xmlAttr *)0x0; attr = attr->next) {
          pxVar1 = attr->name;
          iVar2 = strcmp((char *)pxVar1,"year");
          if (iVar2 == 0) {
            uVar7 = getnumattrib(db,file,(uint)node->line,attr);
            if ((uint)uVar7 <= (db->copyright).firstyear - 1) {
              (db->copyright).firstyear = (uint)uVar7;
            }
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for copyright\n",file,(ulong)node->line,
                    pxVar1);
            db->estatus = 1;
          }
        }
        attr_00 = node->children;
        do {
          if (attr_00 == (xmlNode *)0x0) {
            return 1;
          }
          if (attr_00->type == XML_ELEMENT_NODE) {
            pxVar1 = attr_00->name;
            iVar2 = strcmp((char *)pxVar1,"license");
            if (iVar2 == 0) {
              pcVar24 = (db->copyright).license;
              if (pcVar24 == (char *)0x0) {
                pcVar24 = getcontent(attr_00);
                (db->copyright).license = pcVar24;
              }
              else {
                iVar2 = strcmp(pcVar24,(char *)node->content);
                if (iVar2 != 0) {
                  trytop_cold_1();
                  pcVar24 = *(char **)(pcVar24 + 0x10);
                  iVar2 = strcmp(pcVar24,"brief");
                  if (iVar2 == 0) {
                    uVar6 = 1;
                  }
                  else {
                    iVar2 = strcmp(pcVar24,"doc");
                    uVar6 = (uint)(iVar2 == 0);
                  }
                  return uVar6;
                }
              }
            }
            else {
              iVar2 = strcmp((char *)pxVar1,"author");
              if (iVar2 == 0) {
                prVar23 = (rnnauthor *)calloc(0x30,1);
                p_Var30 = attr_00->children;
                p_Var31 = attr_00->properties;
                pcVar24 = getcontent(attr_00);
                prVar23->contributions = pcVar24;
                for (; p_Var31 != (xmlAttr *)0x0; p_Var31 = p_Var31->next) {
                  pxVar1 = p_Var31->name;
                  iVar2 = strcmp((char *)pxVar1,"name");
                  if (iVar2 == 0) {
                    pcVar24 = getattrib(db,file,(uint)attr_00->line,p_Var31);
                    pcVar24 = strdup(pcVar24);
                    prVar23->name = pcVar24;
                  }
                  else {
                    iVar2 = strcmp((char *)pxVar1,"email");
                    if (iVar2 == 0) {
                      pcVar24 = getattrib(db,file,(uint)attr_00->line,p_Var31);
                      pcVar24 = strdup(pcVar24);
                      prVar23->email = pcVar24;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for author\n",file,
                              (ulong)attr_00->line,pxVar1);
                      db->estatus = 1;
                    }
                  }
                }
                for (; p_Var30 != (_xmlNode *)0x0; p_Var30 = p_Var30->next) {
                  if (p_Var30->type == XML_ELEMENT_NODE) {
                    pxVar1 = p_Var30->name;
                    iVar2 = strcmp((char *)pxVar1,"nick");
                    if (iVar2 == 0) {
                      pcVar24 = (char *)0x0;
                      for (p_Var31 = p_Var30->properties; p_Var31 != (xmlAttr *)0x0;
                          p_Var31 = p_Var31->next) {
                        pxVar1 = p_Var31->name;
                        iVar2 = strcmp((char *)pxVar1,"name");
                        if (iVar2 == 0) {
                          pcVar24 = getattrib(db,file,(uint)p_Var30->line,p_Var31);
                          pcVar24 = strdup(pcVar24);
                        }
                        else {
                          fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for nick\n",file,
                                  (ulong)p_Var30->line,pxVar1);
                          db->estatus = 1;
                        }
                      }
                      if (pcVar24 != (char *)0x0) {
                        iVar2 = prVar23->nicknamesmax;
                        if (iVar2 <= prVar23->nicknamesnum) {
                          iVar4 = iVar2 * 2;
                          if (iVar2 == 0) {
                            iVar4 = 0x10;
                          }
                          prVar23->nicknamesmax = iVar4;
                          ppcVar25 = (char **)realloc(prVar23->nicknames,(long)iVar4 << 3);
                          prVar23->nicknames = ppcVar25;
                        }
                        iVar2 = prVar23->nicknamesnum;
                        prVar23->nicknamesnum = iVar2 + 1;
                        prVar23->nicknames[iVar2] = pcVar24;
                        goto LAB_0024a42e;
                      }
                      fprintf(_stderr,"%s:%d: missing \"name\" attribute for nick\n",file,
                              (ulong)p_Var30->line);
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong tag in author: <%s>\n",file,(ulong)p_Var30->line
                              ,pxVar1);
                    }
                    db->estatus = 1;
                  }
LAB_0024a42e:
                }
                iVar2 = (db->copyright).authorsmax;
                if (iVar2 <= (db->copyright).authorsnum) {
                  iVar4 = iVar2 * 2;
                  if (iVar2 == 0) {
                    iVar4 = 0x10;
                  }
                  (db->copyright).authorsmax = iVar4;
                  pprVar26 = (rnnauthor **)realloc((db->copyright).authors,(long)iVar4 << 3);
                  (db->copyright).authors = pprVar26;
                }
                iVar2 = (db->copyright).authorsnum;
                (db->copyright).authorsnum = iVar2 + 1;
                (db->copyright).authors[iVar2] = prVar23;
              }
              else {
                fprintf(_stderr,"%s:%d: wrong tag in copyright: <%s>\n",file,(ulong)attr_00->line,
                        pxVar1);
                db->estatus = 1;
              }
            }
          }
          attr_00 = attr_00->next;
        } while( true );
      }
      p_Var31 = node->properties;
      if (p_Var31 == (_xmlAttr *)0x0) {
        pcVar24 = (char *)0x0;
      }
      else {
        pcVar24 = (char *)0x0;
        do {
          pxVar1 = p_Var31->name;
          iVar2 = strcmp((char *)pxVar1,"file");
          if (iVar2 == 0) {
            pcVar24 = getattrib(db,file,(uint)node->line,p_Var31);
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for import\n",file,(ulong)node->line,
                    pxVar1);
            db->estatus = 1;
          }
          p_Var31 = p_Var31->next;
        } while (p_Var31 != (_xmlAttr *)0x0);
      }
      if (pcVar24 != (char *)0x0) {
        rnn_parsefile(db,pcVar24);
        return 1;
      }
      uVar29 = (ulong)node->line;
      pcVar24 = "%s:%d: missing \"file\" attribute for import\n";
    }
    goto LAB_0024a73f;
  }
  p_Var31 = node->properties;
  if (p_Var31 == (_xmlAttr *)0x0) {
    pcVar24 = (char *)0x0;
    local_60._0_4_ = 8;
    local_50 = 0;
    iVar2 = 0;
    local_40 = (char *)0x0;
    local_38 = (char *)0x0;
    local_48 = (char *)0x0;
  }
  else {
    local_60 = (char *)0x8;
    local_48 = (char *)0x0;
    local_38 = (char *)0x0;
    local_40 = (char *)0x0;
    iVar2 = 0;
    local_50 = 0;
    pcVar24 = (char *)0x0;
    do {
      pxVar1 = p_Var31->name;
      iVar4 = strcmp((char *)pxVar1,"name");
      if (iVar4 == 0) {
        pcVar24 = getattrib(db,file,(uint)node->line,p_Var31);
      }
      else {
        iVar4 = strcmp((char *)pxVar1,"bare");
        if (iVar4 == 0) {
          iVar2 = getboolattrib(db,file,(uint)node->line,p_Var31);
        }
        else {
          iVar4 = strcmp((char *)pxVar1,"size");
          if (iVar4 == 0) {
            local_50 = getnumattrib(db,file,(uint)node->line,p_Var31);
          }
          else {
            iVar4 = strcmp((char *)pxVar1,"width");
            if (iVar4 == 0) {
              local_60 = (char *)getnumattrib(db,file,(uint)node->line,p_Var31);
            }
            else {
              iVar4 = strcmp((char *)pxVar1,"prefix");
              if (iVar4 == 0) {
                pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                local_40 = strdup(pcVar12);
              }
              else {
                iVar4 = strcmp((char *)pxVar1,"varset");
                if (iVar4 == 0) {
                  pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                  local_38 = strdup(pcVar12);
                }
                else {
                  iVar4 = strcmp((char *)pxVar1,"variants");
                  if (iVar4 == 0) {
                    pcVar12 = getattrib(db,file,(uint)node->line,p_Var31);
                    local_48 = strdup(pcVar12);
                  }
                  else {
                    fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for domain\n",file,
                            (ulong)node->line,pxVar1);
                    db->estatus = 1;
                  }
                }
              }
            }
          }
        }
      }
      p_Var31 = p_Var31->next;
    } while (p_Var31 != (_xmlAttr *)0x0);
  }
  if (pcVar24 == (char *)0x0) {
    fprintf(_stderr,"%s:%d: nameless domain\n",file,(ulong)node->line);
LAB_0024a797:
    db->estatus = 1;
    return 1;
  }
  iVar4 = db->domainsnum;
  if (0 < (long)iVar4) {
    pprVar22 = db->domains;
    lVar32 = 0;
    do {
      prVar21 = pprVar22[lVar32];
      iVar5 = strcmp(prVar21->name,pcVar24);
      if (iVar5 == 0) goto LAB_0024a061;
      lVar32 = lVar32 + 1;
    } while (iVar4 != lVar32);
  }
  prVar21 = (rnndomain *)0x0;
LAB_0024a061:
  if (prVar21 == (rnndomain *)0x0) {
    prVar21 = (rnndomain *)calloc(0x80,1);
    pcVar24 = strdup(pcVar24);
    prVar21->name = pcVar24;
    prVar21->bare = iVar2;
    prVar21->width = (int)local_60;
    prVar21->size = local_50;
    (prVar21->varinfo).prefixstr = local_40;
    (prVar21->varinfo).varsetstr = local_38;
    (prVar21->varinfo).variantsstr = local_48;
    prVar21->file = file;
    iVar2 = db->domainsmax;
    if (iVar2 <= iVar4) {
      iVar4 = 0x10;
      if (iVar2 != 0) {
        iVar4 = iVar2 * 2;
      }
      db->domainsmax = iVar4;
      pprVar22 = (rnndomain **)realloc(db->domains,(long)iVar4 << 3);
      db->domains = pprVar22;
    }
    iVar2 = db->domainsnum;
    db->domainsnum = iVar2 + 1;
    db->domains[iVar2] = prVar21;
    goto LAB_0024a5b3;
  }
  pcVar24 = (prVar21->varinfo).prefixstr;
  if (((((local_40 == (char *)0x0 && pcVar24 == (char *)0x0) ||
        (((local_40 != (char *)0x0 && (pcVar24 != (char *)0x0)) &&
         (iVar4 = strcmp(pcVar24,local_40), iVar4 == 0)))) &&
       ((pcVar24 = (prVar21->varinfo).varsetstr, local_38 == (char *)0x0 && pcVar24 == (char *)0x0
        || (((local_38 != (char *)0x0 && (pcVar24 != (char *)0x0)) &&
            (iVar4 = strcmp(pcVar24,local_38), iVar4 == 0)))))) &&
      ((pcVar24 = (prVar21->varinfo).variantsstr, local_48 == (char *)0x0 && pcVar24 == (char *)0x0
       || (((local_48 != (char *)0x0 && (pcVar24 != (char *)0x0)) &&
           (iVar4 = strcmp(pcVar24,local_48), iVar4 == 0)))))) &&
     ((prVar21->width == (int)local_60 && (prVar21->bare == iVar2)))) {
    if (local_50 != 0) {
      if ((prVar21->size != 0) && (local_50 != prVar21->size)) goto LAB_0024a569;
      prVar21->size = local_50;
    }
  }
  else {
LAB_0024a569:
    fprintf(_stderr,"%s:%d: merge fail for domain %s\n",file,(ulong)node->line,node->name);
    db->estatus = 1;
  }
  free(local_40);
  free(local_38);
  free(local_48);
LAB_0024a5b3:
  for (prVar33 = (rnndb *)node->children; prVar33 != (rnndb *)0x0;
      prVar33 = (rnndb *)prVar33->bitsets) {
    if (*(int *)&(prVar33->copyright).license == 1) {
      prVar27 = trydelem(db,file,(xmlNode *)prVar33);
      if (prVar27 == (rnndelem *)0x0) {
        pcVar24 = file;
        iVar2 = trytop(db,file,(xmlNode *)prVar33);
        if ((iVar2 == 0) && (iVar2 = trydoc(prVar33,pcVar24,node_04), iVar2 == 0)) {
          fprintf(_stderr,"%s:%d: wrong tag in domain: <%s>\n",file,
                  (ulong)*(ushort *)&prVar33->files,(prVar33->copyright).authors);
          db->estatus = 1;
        }
      }
      else {
        iVar2 = prVar21->subelemsmax;
        if (iVar2 <= prVar21->subelemsnum) {
          iVar4 = iVar2 * 2;
          if (iVar2 == 0) {
            iVar4 = 0x10;
          }
          prVar21->subelemsmax = iVar4;
          pprVar28 = (rnndelem **)realloc(prVar21->subelems,(long)iVar4 << 3);
          prVar21->subelems = pprVar28;
        }
        iVar2 = prVar21->subelemsnum;
        prVar21->subelemsnum = iVar2 + 1;
        prVar21->subelems[iVar2] = prVar27;
      }
    }
  }
  return 1;
}

Assistant:

static int trytop (struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "enum")) {
		parseenum(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "bitset")) {
		parsebitset(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "group")) {
		parsegroup(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "domain")) {
		parsedomain(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "spectype")) {
		parsespectype(db, file, node);
		return 1;
	} else if (!strcmp(node->name, "import")) {
		xmlAttr *attr = node->properties;
		char *subfile = 0;
		while (attr) {
			if (!strcmp(attr->name, "file")) {
				subfile = getattrib(db, file, node->line, attr);
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for import\n", file, node->line, attr->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!subfile) {
			fprintf (stderr, "%s:%d: missing \"file\" attribute for import\n", file, node->line);
			db->estatus = 1;
		} else {
			rnn_parsefile(db, subfile);
		}
		return 1;
	} else if (!strcmp(node->name, "copyright")) {
		parsecopyright(db, file, node);
		return 1;
	}
	return 0;
}